

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

double __thiscall Imath_3_2::Vec2<double>::lengthTiny(Vec2<double> *this)

{
  int in_EDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double max;
  double absY;
  double absX;
  undefined8 local_28;
  undefined8 local_8;
  
  std::abs(in_EDI);
  std::abs(in_EDI);
  local_28 = extraout_XMM0_Qa;
  if (extraout_XMM0_Qa < extraout_XMM0_Qa_00) {
    local_28 = extraout_XMM0_Qa_00;
  }
  if ((local_28 != 0.0) || (NAN(local_28))) {
    local_8 = sqrt((extraout_XMM0_Qa / local_28) * (extraout_XMM0_Qa / local_28) +
                   (extraout_XMM0_Qa_00 / local_28) * (extraout_XMM0_Qa_00 / local_28));
    local_8 = local_28 * local_8;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Vec2<T>::lengthTiny () const IMATH_NOEXCEPT
{
    T absX = std::abs (x);
    T absY = std::abs (y);

    T max = absX;

    if (max < absY) max = absY;

    if (IMATH_UNLIKELY (max == T (0))) return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;

    return max * std::sqrt (absX * absX + absY * absY);
}